

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O3

void __thiscall icu_63::NFRuleSet::appendRules(NFRuleSet *this,UnicodeString *result)

{
  short sVar1;
  NFRule *this_00;
  NFRule *this_01;
  uint uVar2;
  int32_t srcLength;
  long lVar3;
  ulong uVar4;
  UChar local_3a [5];
  
  sVar1 = (this->name).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (this->name).fUnion.fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  UnicodeString::doAppend(result,&this->name,0,srcLength);
  local_3a[3] = 0x3a;
  UnicodeString::doAppend(result,local_3a + 3,0,1);
  local_3a[4] = 10;
  UnicodeString::doAppend(result,local_3a + 4,0,1);
  if ((this->rules).fCount != 0) {
    uVar4 = 0;
    do {
      NFRule::_appendRuleText((this->rules).fStuff[uVar4],result);
      local_3a[0] = L'\n';
      UnicodeString::doAppend(result,local_3a,0,1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->rules).fCount);
  }
  lVar3 = 0;
  do {
    this_00 = this->nonNumericalRules[lVar3];
    if (this_00 != (NFRule *)0x0) {
      if (this_00->baseValue + 4U < 3) {
        uVar2 = (this->fractionRules).fCount;
        if (uVar2 != 0) {
          uVar4 = 0;
          do {
            this_01 = (this->fractionRules).fStuff[uVar4];
            if (this_01->baseValue == this_00->baseValue) {
              NFRule::_appendRuleText(this_01,result);
              local_3a[1] = 10;
              UnicodeString::doAppend(result,local_3a + 1,0,1);
              uVar2 = (this->fractionRules).fCount;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar2);
        }
      }
      else {
        NFRule::_appendRuleText(this_00,result);
        local_3a[2] = 10;
        UnicodeString::doAppend(result,local_3a + 2,0,1);
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

void
NFRuleSet::appendRules(UnicodeString& result) const
{
    uint32_t i;

    // the rule set name goes first...
    result.append(name);
    result.append(gColon);
    result.append(gLineFeed);

    // followed by the regular rules...
    for (i = 0; i < rules.size(); i++) {
        rules[i]->_appendRuleText(result);
        result.append(gLineFeed);
    }

    // followed by the special rules (if they exist)
    for (i = 0; i < NON_NUMERICAL_RULE_LENGTH; ++i) {
        NFRule *rule = nonNumericalRules[i];
        if (nonNumericalRules[i]) {
            if (rule->getBaseValue() == NFRule::kImproperFractionRule
                || rule->getBaseValue() == NFRule::kProperFractionRule
                || rule->getBaseValue() == NFRule::kMasterRule)
            {
                for (uint32_t fIdx = 0; fIdx < fractionRules.size(); fIdx++) {
                    NFRule *fractionRule = fractionRules[fIdx];
                    if (fractionRule->getBaseValue() == rule->getBaseValue()) {
                        fractionRule->_appendRuleText(result);
                        result.append(gLineFeed);
                    }
                }
            }
            else {
                rule->_appendRuleText(result);
                result.append(gLineFeed);
            }
        }
    }
}